

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
::reserve(raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          *this,size_t n)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  CommonFields *pCVar4;
  ulong local_40;
  HashtablezInfoHandle local_29;
  size_t local_28;
  size_t m;
  size_t max_size_before_growth;
  size_t n_local;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *this_local;
  
  max_size_before_growth = n;
  n_local = (size_t)this;
  bVar1 = is_soo(this);
  if (bVar1) {
    local_40 = SooCapacity();
  }
  else {
    sVar2 = size(this);
    sVar3 = growth_left(this);
    local_40 = sVar2 + sVar3;
  }
  sVar2 = max_size_before_growth;
  m = local_40;
  if (local_40 < max_size_before_growth) {
    sVar3 = max_size(this);
    if (sVar3 < sVar2) {
      HashTableSizeOverflow();
    }
    local_28 = GrowthToLowerboundCapacity(max_size_before_growth);
    sVar2 = NormalizeCapacity(local_28);
    resize(this,sVar2);
    infoz(this);
    HashtablezInfoHandle::RecordReservation(&local_29,max_size_before_growth);
  }
  pCVar4 = common(this);
  CommonFields::reset_reserved_growth(pCVar4,max_size_before_growth);
  pCVar4 = common(this);
  CommonFieldsGenerationInfoDisabled::set_reservation_size
            ((CommonFieldsGenerationInfoDisabled *)pCVar4,max_size_before_growth);
  return;
}

Assistant:

void reserve(size_t n) {
    const size_t max_size_before_growth =
        is_soo() ? SooCapacity() : size() + growth_left();
    if (n > max_size_before_growth) {
      if (ABSL_PREDICT_FALSE(n > max_size())) {
        HashTableSizeOverflow();
      }
      size_t m = GrowthToLowerboundCapacity(n);
      resize(NormalizeCapacity(m));

      // This is after resize, to ensure that we have completed the allocation
      // and have potentially sampled the hashtable.
      infoz().RecordReservation(n);
    }
    common().reset_reserved_growth(n);
    common().set_reservation_size(n);
  }